

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitCallRef(PrintExpressionContents *this,CallRef *curr)

{
  HeapType type;
  char *pcVar1;
  bool bVar3;
  string_view str;
  size_t sVar2;
  
  pcVar1 = "call_ref ";
  bVar3 = curr->isReturn != false;
  if (bVar3) {
    pcVar1 = "return_call_ref ";
  }
  sVar2 = 9;
  if (bVar3) {
    sVar2 = 0x10;
  }
  str._M_str = pcVar1;
  str._M_len = sVar2;
  printMedium(this->o,str);
  type = wasm::Type::getHeapType(&curr->target->type);
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
    printMedium(o, curr->isReturn ? "return_call_ref " : "call_ref ");
    printHeapTypeName(curr->target->type.getHeapType());
  }